

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O2

void __thiscall Fl_Slider::draw(Fl_Slider *this,int X,int Y,int W,int H)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  Fl_Color FVar5;
  _func_int **pp_Var6;
  byte bVar7;
  int iVar8;
  int X_00;
  uint uVar9;
  uint uVar10;
  Fl_Boxtype t;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int H_00;
  int iVar15;
  double dVar16;
  double dVar17;
  int local_60;
  
  dVar1 = (this->super_Fl_Valuator).min;
  dVar2 = (this->super_Fl_Valuator).max;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    dVar17 = ((this->super_Fl_Valuator).value_ - dVar1) / (dVar2 - dVar1);
    dVar16 = 1.0;
    if ((dVar17 <= 1.0) && (dVar16 = dVar17, dVar17 < 0.0)) {
      dVar16 = 0.0;
    }
  }
  else {
    dVar16 = 0.5;
  }
  bVar3 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  iVar14 = W;
  if ((bVar3 & 1) == 0) {
    iVar14 = H;
  }
  if ((bVar3 & 0xfe) == 2) {
    H_00 = (int)(dVar16 * (double)iVar14 + 0.5);
    if (dVar1 <= dVar2) {
      local_60 = 0;
    }
    else {
      local_60 = H_00;
      H_00 = iVar14 - H_00;
    }
  }
  else {
    H_00 = (int)((float)iVar14 * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
    iVar15 = H;
    if ((bVar3 & 1) == 0) {
      iVar15 = W;
    }
    iVar15 = iVar15 / 2 + (uint)((bVar3 & 0xfe) == 4) * 4 + 1;
    if (H_00 < iVar15) {
      H_00 = iVar15;
    }
    local_60 = (int)(dVar16 * (double)(iVar14 - H_00) + 0.5);
  }
  if ((bVar3 & 1) == 0) {
    local_60 = local_60 + Y;
    iVar14 = W;
    iVar15 = X;
  }
  else {
    iVar15 = local_60 + X;
    iVar14 = H_00;
    H_00 = H;
    local_60 = Y;
  }
  draw_bg(this,X,Y,W,H);
  bVar3 = (this->super_Fl_Valuator).super_Fl_Widget.box_ & 0xfe;
  if (bVar3 == 0) {
    bVar3 = 2;
  }
  bVar7 = (byte)*(undefined4 *)&this->slider_;
  if (bVar7 != 0) {
    bVar3 = bVar7;
  }
  bVar7 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  t = (Fl_Boxtype)bVar3;
  if (bVar7 == 5) {
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar15,local_60,iVar14,H_00,0x31);
    iVar12 = (iVar14 + -4) / 2;
    X_00 = iVar12 + iVar15;
    iVar8 = local_60 + 2;
    iVar12 = iVar14 + iVar12 * -2;
    iVar13 = H_00 + -4;
  }
  else {
    if (bVar7 != 4) {
      if (0 < H_00 && 0 < iVar14) {
        Fl_Widget::draw_box((Fl_Widget *)this,t,iVar15,local_60,iVar14,H_00,
                            (this->super_Fl_Valuator).super_Fl_Widget.color2_);
        bVar7 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
      }
      if ((bVar7 & 0xfe) != 2) {
        iVar12 = Fl::is_scheme("gtk+");
        if (iVar12 != 0) {
          if ((H < W) && (H_00 + 8 < iVar14)) {
            iVar12 = ((iVar14 - H_00) + -4) / 2;
            uVar10 = iVar12 + iVar15;
            uVar4 = local_60 + 3;
            FVar5 = fl_darker((this->super_Fl_Valuator).super_Fl_Widget.color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar5);
            uVar9 = (H_00 + local_60) - 5;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar10,(ulong)uVar9,(ulong)(H_00 + -8 + uVar10),
                       (ulong)uVar4);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)(iVar15 + iVar12 + 6),(ulong)uVar9,
                       (ulong)(H_00 + -2 + uVar10),(ulong)uVar4);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)(iVar15 + iVar12 + 0xc),(ulong)uVar9,
                       (ulong)(H_00 + 4 + uVar10),(ulong)uVar4);
            FVar5 = fl_lighter((this->super_Fl_Valuator).super_Fl_Widget.color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar5);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)(iVar12 + iVar15 + 1),(ulong)uVar9,
                       (ulong)((H_00 + uVar10) - 7),(ulong)uVar4);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)(iVar12 + iVar15 + 7),(ulong)uVar9,
                       (ulong)(H_00 + -1 + uVar10),(ulong)uVar4);
            uVar11 = iVar12 + iVar15 + 0xd;
            uVar10 = H_00 + 5 + uVar10;
            pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          }
          else {
            if ((H <= W) || (H_00 <= iVar14 + 8)) goto LAB_001c69b4;
            uVar11 = iVar15 + 4;
            iVar12 = ((H_00 - iVar14) + -4) / 2;
            iVar8 = iVar12 + local_60;
            FVar5 = fl_darker((this->super_Fl_Valuator).super_Fl_Widget.color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar5);
            uVar10 = iVar14 + -4 + iVar15;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar11,(ulong)((iVar14 + iVar8) - 8),(ulong)uVar10)
            ;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar11,(ulong)((iVar14 + iVar8) - 2),(ulong)uVar10,
                       (ulong)(uint)(iVar12 + 6 + local_60));
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar11,(ulong)(iVar14 + iVar8 + 4),(ulong)uVar10,
                       (ulong)(uint)(iVar12 + 0xc + local_60));
            FVar5 = fl_lighter((this->super_Fl_Valuator).super_Fl_Widget.color2_);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)FVar5);
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar11,(ulong)((iVar14 + iVar8) - 7),(ulong)uVar10,
                       (ulong)(iVar12 + local_60 + 1));
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                      (fl_graphics_driver,(ulong)uVar11,(ulong)((iVar14 + iVar8) - 1),(ulong)uVar10,
                       (ulong)(uint)(iVar12 + 7 + local_60));
            uVar9 = iVar14 + iVar8 + 5;
            uVar4 = iVar12 + 0xd + local_60;
            pp_Var6 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
          }
          (*pp_Var6[0xc])(fl_graphics_driver,(ulong)uVar11,(ulong)uVar9,(ulong)uVar10,(ulong)uVar4);
        }
      }
      goto LAB_001c69b4;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar3,iVar15,local_60,iVar14,H_00,0x31);
    iVar13 = (H_00 + -4) / 2;
    X_00 = iVar15 + 2;
    iVar8 = iVar13 + local_60;
    iVar12 = iVar14 + -4;
    iVar13 = H_00 + iVar13 * -2;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,X_00,iVar8,iVar12,iVar13,
                      (this->super_Fl_Valuator).super_Fl_Widget.color2_);
LAB_001c69b4:
  Fl_Widget::draw_label((Fl_Widget *)this,iVar15,local_60,iVar14,H_00);
  if ((Fl_Slider *)Fl::focus_ != this) {
    return;
  }
  if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 0xfe) == 2) {
    Fl_Widget::draw_focus((Fl_Widget *)this);
    return;
  }
  Fl_Widget::draw_focus((Fl_Widget *)this,t,iVar15,local_60,iVar14,H_00);
  return;
}

Assistant:

void Fl_Slider::draw(int X, int Y, int W, int H) {

  double val;
  if (minimum() == maximum())
    val = 0.5;
  else {
    val = (value()-minimum())/(maximum()-minimum());
    if (val > 1.0) val = 1.0;
    else if (val < 0.0) val = 0.0;
  }

  int ww = (horizontal() ? W : H);
  int xx, S;
  if (type()==FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {
    S = int(val*ww+.5);
    if (minimum()>maximum()) {S = ww-S; xx = ww-S;}
    else xx = 0;
  } else {
    S = int(slider_size_*ww+.5);
    int T = (horizontal() ? H : W)/2+1;
    if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
    if (S < T) S = T;
    xx = int(val*(ww-S)+.5);
  }
  int xsl, ysl, wsl, hsl;
  if (horizontal()) {
    xsl = X+xx;
    wsl = S;
    ysl = Y;
    hsl = H;
  } else {
    ysl = Y+xx;
    hsl = S;
    xsl = X;
    wsl = W;
  }

  draw_bg(X, Y, W, H);

  Fl_Boxtype box1 = slider();
  if (!box1) {box1 = (Fl_Boxtype)(box()&-2); if (!box1) box1 = FL_UP_BOX;}
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (hsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+2, ysl+d, wsl-4, hsl-2*d,selection_color());
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (wsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+d, ysl+2, wsl-2*d, hsl-4,selection_color());
  } else {
    if (wsl>0 && hsl>0) draw_box(box1, xsl, ysl, wsl, hsl, selection_color());

    if (type() != FL_HOR_FILL_SLIDER && type() != FL_VERT_FILL_SLIDER &&
        Fl::is_scheme("gtk+")) {
      if (W>H && wsl>(hsl+8)) {
        // Draw horizontal grippers
	int yy, hh;
	hh = hsl-8;
	xx = xsl+(wsl-hsl-4)/2;
	yy = ysl+3;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);

        xx++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);
      } else if (H>W && hsl>(wsl+8)) {
        // Draw vertical grippers
	int yy;
	xx = xsl+4;
	ww = wsl-8;
	yy = ysl+(hsl-wsl-4)/2;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);

        yy++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);
      }
    }
  }

  draw_label(xsl, ysl, wsl, hsl);
  if (Fl::focus() == this) {
    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) draw_focus();
    else draw_focus(box1, xsl, ysl, wsl, hsl);
  }
}